

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CEseqExpression *expression)

{
  initializer_list<const_IRT::INode_*> __l;
  ChildrenAnswers answers;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  allocator_type local_c9;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_c8;
  string local_b0;
  ChildrenAnswers local_90;
  ChildrenAnswers local_60;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_30;
  
  local_60.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CEseqExpression::getStatement(expression);
  local_60.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CEseqExpression::getExpression(expression);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_60;
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            (&local_30,__l,&local_c9);
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector(&local_c8,&local_30);
  VisitChildren(&local_60,this,&local_c8);
  if (local_c8.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90.descriptions,&local_60.descriptions);
  std::vector<int,_std::allocator<int>_>::vector(&local_90.ids,&local_60.ids);
  AddChildrenAnswers(this,&local_90);
  if (local_90.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.descriptions);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Eseq","");
  AddLabel(this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.descriptions);
  if (local_30.super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CEseqExpression &expression ) {
    std::vector<const IRT::INode *> children = { expression.getStatement( ), expression.getExpression( ) };
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "Eseq" );
    ++lastVisited;
}